

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

char * bam_flag2str(int flag)

{
  char *pcVar1;
  kstring_t local_28;
  
  local_28.l = 0;
  local_28.m = 0;
  local_28.s = (char *)0x0;
  if ((flag & 1U) != 0) {
    ksprintf(&local_28,"%s%s","");
  }
  if ((flag & 2U) != 0) {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if ((flag & 4U) != 0) {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if ((flag & 8U) != 0) {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if ((flag & 0x10U) != 0) {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if ((flag & 0x20U) != 0) {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if ((flag & 0x40U) != 0) {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if ((char)flag < '\0') {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if (((uint)flag >> 8 & 1) != 0) {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if (((uint)flag >> 9 & 1) != 0) {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if (((uint)flag >> 10 & 1) != 0) {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if (((uint)flag >> 0xb & 1) != 0) {
    pcVar1 = ",";
    if (local_28.l == 0) {
      pcVar1 = "";
    }
    ksprintf(&local_28,"%s%s",pcVar1);
  }
  if (local_28.l == 0) {
    if (local_28.m < 2) {
      local_28.m = 2;
      pcVar1 = (char *)realloc(local_28.s,2);
      if (pcVar1 == (char *)0x0) {
        return local_28.s;
      }
    }
    else {
      local_28.l = 0;
      pcVar1 = local_28.s;
    }
    local_28.s = pcVar1;
    local_28.s[local_28.l] = '\0';
  }
  return local_28.s;
}

Assistant:

char *bam_flag2str(int flag)
{
    kstring_t str = {0,0,0};
    if ( flag&BAM_FPAIRED ) ksprintf(&str,"%s%s", str.l?",":"","PAIRED");
    if ( flag&BAM_FPROPER_PAIR ) ksprintf(&str,"%s%s", str.l?",":"","PROPER_PAIR");
    if ( flag&BAM_FUNMAP ) ksprintf(&str,"%s%s", str.l?",":"","UNMAP");
    if ( flag&BAM_FMUNMAP ) ksprintf(&str,"%s%s", str.l?",":"","MUNMAP");
    if ( flag&BAM_FREVERSE ) ksprintf(&str,"%s%s", str.l?",":"","REVERSE");
    if ( flag&BAM_FMREVERSE ) ksprintf(&str,"%s%s", str.l?",":"","MREVERSE");
    if ( flag&BAM_FREAD1 ) ksprintf(&str,"%s%s", str.l?",":"","READ1");
    if ( flag&BAM_FREAD2 ) ksprintf(&str,"%s%s", str.l?",":"","READ2");
    if ( flag&BAM_FSECONDARY ) ksprintf(&str,"%s%s", str.l?",":"","SECONDARY");
    if ( flag&BAM_FQCFAIL ) ksprintf(&str,"%s%s", str.l?",":"","QCFAIL");
    if ( flag&BAM_FDUP ) ksprintf(&str,"%s%s", str.l?",":"","DUP");
    if ( flag&BAM_FSUPPLEMENTARY ) ksprintf(&str,"%s%s", str.l?",":"","SUPPLEMENTARY");
    if ( str.l == 0 ) kputsn("", 0, &str);
    return str.s;
}